

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::~CommandLineInterfaceTester
          (CommandLineInterfaceTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_00586530;
  bVar3 = File::Exists(&this->temp_directory_);
  if (bVar3) {
    File::DeleteRecursively(&this->temp_directory_,(void *)0x0,(void *)0x0);
  }
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ::~vector(&this->generators_);
  pcVar2 = (this->captured_stdout_)._M_dataplus._M_p;
  paVar1 = &(this->captured_stdout_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->captured_stderr_)._M_dataplus._M_p;
  paVar1 = &(this->captured_stderr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->temp_directory_)._M_dataplus._M_p;
  paVar1 = &(this->temp_directory_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  CommandLineInterface::~CommandLineInterface(&this->cli_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

CommandLineInterfaceTester::~CommandLineInterfaceTester() {
  // Delete the temp directory.
  if (FileExists(temp_directory_)) {
    File::DeleteRecursively(temp_directory_, NULL, NULL);
  }
}